

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionloader.cpp
# Opt level: O2

void __thiscall
stackjit::FunctionLoader::generateDefinition
          (FunctionLoader *this,Function *function,FunctionDefinition *definition)

{
  VMState *pVVar1;
  pointer pbVar2;
  bool bVar3;
  AccessModifier accessModifier;
  bool bVar4;
  Type *returnType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  Type *pTVar6;
  ClassType *classType;
  AttributeContainer *pAVar7;
  runtime_error *this_00;
  pointer pbVar8;
  string local_1c8;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> parameters;
  _Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> local_180;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param;
  string local_50;
  
  pVVar1 = this->mVMState;
  Loader::Function::returnType_abi_cxx11_(&local_108,function);
  returnType = LoaderHelpers::getType(pVVar1,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  parameters.super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parameters.super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parameters.super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar5 = Loader::Function::parameters_abi_cxx11_(function);
  pbVar2 = (pvVar5->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar8 = (pvVar5->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1) {
    std::__cxx11::string::string((string *)&param,(string *)pbVar8);
    pVVar1 = this->mVMState;
    std::__cxx11::string::string((string *)&local_50,(string *)&param);
    local_1c8._M_dataplus._M_p = (pointer)LoaderHelpers::getType(pVVar1,&local_50);
    std::vector<stackjit::Type_const*,std::allocator<stackjit::Type_const*>>::
    emplace_back<stackjit::Type_const*>
              ((vector<stackjit::Type_const*,std::allocator<stackjit::Type_const*>> *)&parameters,
               (Type **)&local_1c8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&param);
  }
  bVar3 = Loader::Function::isMemberFunction(function);
  if (bVar3) {
    pVVar1 = this->mVMState;
    Loader::Function::className_abi_cxx11_(&param,function);
    std::operator+(&local_148,"Ref.",&param);
    pTVar6 = LoaderHelpers::getType(pVVar1,&local_148);
    if (pTVar6 == (Type *)0x0) {
      classType = (ClassType *)0x0;
    }
    else {
      classType = (ClassType *)__dynamic_cast(pTVar6,&Type::typeinfo,&ClassType::typeinfo,0);
    }
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&param);
    if (classType == (ClassType *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      Loader::Function::className_abi_cxx11_(&local_128,function);
      std::operator+(&local_1c8,"\'",&local_128);
      std::operator+(&param,&local_1c8,"\' is not a class type.");
      std::runtime_error::runtime_error(this_00,(string *)&param);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pAVar7 = Loader::Function::attributes_abi_cxx11_(function);
    accessModifier = LoaderHelpers::getAccessModifier(pAVar7);
    pAVar7 = Loader::Function::attributes_abi_cxx11_(function);
    bVar3 = LoaderHelpers::getIsVirtual(pAVar7);
  }
  else {
    accessModifier = Public;
    classType = (ClassType *)0x0;
    bVar3 = false;
  }
  bVar4 = Loader::Function::isMemberFunction(function);
  if (bVar4) {
    Loader::Function::memberFunctionName_abi_cxx11_(&local_168,function);
  }
  else {
    Loader::Function::name_abi_cxx11_(&local_168,function);
  }
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
            ((vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)&local_180,
             &parameters);
  Loader::Function::memberFunctionName_abi_cxx11_(&local_1c8,function);
  bVar4 = std::operator==(&local_1c8,".constructor");
  FunctionDefinition::FunctionDefinition
            ((FunctionDefinition *)&param,&local_168,
             (vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)&local_180,
             returnType,classType,accessModifier,bVar4,bVar3);
  FunctionDefinition::operator=(definition,(FunctionDefinition *)&param);
  FunctionDefinition::~FunctionDefinition((FunctionDefinition *)&param);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::_Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::~_Vector_base
            (&local_180);
  std::__cxx11::string::~string((string *)&local_168);
  std::_Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::~_Vector_base
            (&parameters.
              super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>);
  return;
}

Assistant:

void FunctionLoader::generateDefinition(const Loader::Function& function, FunctionDefinition& definition) {
		auto returnType = LoaderHelpers::getType(mVMState, function.returnType());

		std::vector<const Type*> parameters;
		for (auto param : function.parameters()) {
			parameters.push_back(LoaderHelpers::getType(mVMState, param));
		}

		const ClassType* classType = nullptr;
		AccessModifier accessModifier = DEFAULT_ACCESS_MODIFIER;
		bool isVirtual = false;

		if (function.isMemberFunction()) {
			classType = dynamic_cast<const ClassType*>(LoaderHelpers::getType(mVMState, "Ref." + function.className()));
			if (classType == nullptr) {
				throw std::runtime_error("'" + function.className() + "' is not a class type.");
			}

			accessModifier = LoaderHelpers::getAccessModifier(function.attributes());
			isVirtual = LoaderHelpers::getIsVirtual(function.attributes());
		}

		definition = FunctionDefinition(
			function.isMemberFunction() ? function.memberFunctionName() : function.name(),
			parameters,
			returnType,
			classType,
			accessModifier,
			function.memberFunctionName() == ".constructor",
			isVirtual);
	}